

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerFactory.cpp
# Opt level: O1

void helics::BrokerFactory::terminateAllBrokers(void)

{
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  *__range2;
  shared_ptr<helics::Broker> *brk;
  pointer psVar1;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> brokers
  ;
  vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  local_28;
  
  gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::getObjects
            (&local_28,(SearchableObjectHolder<helics::Broker,_helics::CoreType> *)searchableBrokers
            );
  for (psVar1 = local_28.
                super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar1 != local_28.
                super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar1 = psVar1 + 1) {
    (*((psVar1->super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_Broker[3])();
  }
  gmlc::concurrency::DelayedDestructor<helics::Broker>::destroyObjects
            ((DelayedDestructor<helics::Broker> *)delayedDestroyer,(milliseconds)0xfa);
  std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>::
  ~vector(&local_28);
  return;
}

Assistant:

std::vector<std::shared_ptr<Broker>> getAllBrokers()
{
    return searchableBrokers.getObjects();
}